

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void av1_build_prediction_by_above_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  MB_MODE_INFO **ppMVar4;
  MB_MODE_INFO *above_mbmi;
  long lVar5;
  byte op_mi_size;
  long lVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  build_prediction_ctxt ctxt;
  
  if (xd->up_available == true) {
    ctxt.mb_to_far_edge = xd->mb_to_right_edge;
    ctxt.dcb = (void *)0x0;
    ppMVar4 = xd->mi;
    bVar14 = cm->seq_params->monochrome == '\0';
    iVar2 = xd->mi_col;
    uVar10 = (ulong)iVar2;
    iVar8 = (uint)xd->width + iVar2;
    iVar3 = (cm->mi_params).mi_cols;
    if (iVar3 <= iVar8) {
      iVar8 = iVar3;
    }
    if (((0x3efffcUL >> ((ulong)(*ppMVar4)->bsize & 0x3f) & 1) != 0) && (iVar2 < iVar8)) {
      iVar3 = max_neighbor_obmc[""[(*ppMVar4)->bsize]];
      lVar6 = (long)xd->mi_stride;
      iVar13 = 0;
      uVar12 = uVar10;
      ctxt.cm = cm;
      ctxt.tmp_buf = tmp_buf;
      ctxt.tmp_width = tmp_width;
      ctxt.tmp_height = tmp_height;
      ctxt.tmp_stride = tmp_stride;
      do {
        uVar11 = (uint)uVar12;
        bVar7 = 0x10;
        if ((0x1f07ffUL >> ((ulong)ppMVar4[((int)uVar11 - lVar6) - uVar10]->bsize & 0x3f) & 1) != 0)
        {
          bVar7 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [ppMVar4[((int)uVar11 - lVar6) - uVar10]->bsize];
        }
        lVar5 = ((int)uVar11 - lVar6) - uVar10;
        uVar9 = uVar11 & 0xfffffffe;
        if (bVar7 == 1) {
          bVar7 = 2;
          uVar11 = uVar9;
          lVar5 = (((long)(int)uVar9 + 1) - lVar6) - uVar10;
        }
        above_mbmi = ppMVar4[lVar5];
        if (((above_mbmi->field_0xa7 & 0x80) != 0) || ('\0' < above_mbmi->ref_frame[0])) {
          iVar13 = iVar13 + 1;
          uVar1 = xd->width;
          op_mi_size = uVar1;
          if (bVar7 <= (byte)uVar1) {
            op_mi_size = bVar7;
          }
          build_obmc_prediction
                    (xd,0,uVar11 - iVar2,op_mi_size,0,above_mbmi,&ctxt,bVar14 + 1 + (uint)bVar14);
        }
        uVar12 = (ulong)(uVar11 + bVar7);
      } while (((int)(uVar11 + bVar7) < iVar8) && (iVar13 < iVar3));
    }
  }
  return;
}

Assistant:

void av1_build_prediction_by_above_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                         uint8_t *tmp_buf[MAX_MB_PLANE],
                                         int tmp_width[MAX_MB_PLANE],
                                         int tmp_height[MAX_MB_PLANE],
                                         int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->up_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_right_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_above(cm, xd,
                                max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                build_obmc_prediction, &ctxt);
}